

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

int glfwJoystickIsGamepad(int jid)

{
  GLFWbool GVar1;
  int iVar2;
  uint uVar3;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/input.c"
                  ,0x4b8,"int glfwJoystickIsGamepad(int)");
  }
  if ((uint)jid < 0x10) {
    if (_glfw.initialized == 0) {
      uVar3 = 0;
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      GVar1 = initJoysticks();
      uVar3 = 0;
      if ((GVar1 != 0) && (_glfw.joysticks[(uint)jid].present != 0)) {
        uVar3 = 0;
        iVar2 = _glfwPlatformPollJoystick(_glfw.joysticks + (uint)jid,0);
        if (iVar2 != 0) {
          uVar3 = (uint)(_glfw.joysticks[(uint)jid].mapping != (_GLFWmapping *)0x0);
        }
      }
    }
    return uVar3;
  }
  __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/src/input.c"
                ,0x4b9,"int glfwJoystickIsGamepad(int)");
}

Assistant:

GLFWAPI int glfwJoystickIsGamepad(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return GLFW_FALSE;
    }

    if (!initJoysticks())
        return GLFW_FALSE;

    js = _glfw.joysticks + jid;
    if (!js->present)
        return GLFW_FALSE;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_PRESENCE))
        return GLFW_FALSE;

    return js->mapping != NULL;
}